

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

FloatImage * __thiscall nv::FloatImage::fastDownSample(FloatImage *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint32 uVar5;
  float *pfVar6;
  uint uVar7;
  FloatImage *pFVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  ushort uVar12;
  uint x;
  uint uVar13;
  uint uVar14;
  uint y_1;
  float *pfVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint y;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  ushort uVar23;
  uint uVar24;
  long lVar25;
  float *pfVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint n;
  
  pFVar8 = (FloatImage *)operator_new(0x20);
  pFVar8->_vptr_FloatImage = (_func_int **)&PTR__FloatImage_0024d850;
  pFVar8->m_mem = (float *)0x0;
  pFVar8->m_width = 0;
  pFVar8->m_height = 0;
  pFVar8->m_componentNum = 0;
  pFVar8->m_count = 0;
  uVar23 = this->m_width >> 1;
  uVar23 = uVar23 + (uVar23 == 0);
  uVar12 = this->m_height >> 1;
  uVar12 = uVar12 + (uVar12 == 0);
  uVar5 = this->m_componentNum;
  mem::free((void *)0x0);
  uVar13 = (uint)uVar12;
  pFVar8->m_mem = (float *)0x0;
  pFVar8->m_width = uVar23;
  pFVar8->m_height = uVar12;
  pFVar8->m_componentNum = uVar5;
  uVar7 = uVar13 * uVar23;
  uVar24 = uVar5 * uVar7;
  pFVar8->m_count = uVar24;
  pfVar9 = (float *)mem::malloc((ulong)uVar24 << 2);
  pFVar8->m_mem = pfVar9;
  uVar1 = this->m_width;
  uVar24 = (uint)uVar1;
  if ((uVar1 == 1) || (uVar2 = this->m_height, uVar2 == 1)) {
    uVar24 = this->m_height * uVar24;
    if ((uVar24 & 1) == 0) {
      uVar13 = this->m_componentNum;
      if ((ulong)uVar13 != 0) {
        pfVar6 = this->m_mem;
        uVar1 = pFVar8->m_width;
        uVar23 = pFVar8->m_height;
        uVar18 = 0;
        uVar21 = 0;
        uVar20 = 0;
        do {
          lVar25 = 0;
          do {
            pfVar9[(ulong)uVar18 + lVar25] =
                 (pfVar6[uVar21 + lVar25 * 2] + pfVar6[uVar21 + lVar25 * 2 + 1]) * 0.5;
            lVar25 = lVar25 + 1;
          } while (uVar7 != (uint)lVar25);
          uVar20 = uVar20 + 1;
          uVar21 = (ulong)((int)uVar21 + uVar24);
          uVar18 = uVar18 + (uint)uVar23 * (uint)uVar1;
        } while (uVar20 != uVar13);
      }
    }
    else {
      uVar13 = this->m_componentNum;
      if ((ulong)uVar13 != 0) {
        pfVar6 = this->m_mem;
        uVar1 = pFVar8->m_width;
        uVar23 = pFVar8->m_height;
        uVar18 = 0;
        uVar19 = 0;
        uVar21 = 0;
        do {
          lVar25 = 0;
          uVar14 = uVar7;
          do {
            uVar16 = (uint)(lVar25 + 1);
            pfVar9[(ulong)uVar18 + lVar25] =
                 ((float)(int)uVar16 * pfVar6[(ulong)uVar19 + lVar25 * 2 + 2] +
                 (float)uVar14 * pfVar6[(ulong)uVar19 + lVar25 * 2] +
                 pfVar6[(ulong)uVar19 + lVar25 * 2 + 1] * (float)(int)uVar7) *
                 (1.0 / (float)(int)(uVar7 * 2 + 1));
            uVar14 = uVar14 - 1;
            lVar25 = lVar25 + 1;
          } while (uVar16 != uVar7);
          uVar21 = uVar21 + 1;
          uVar19 = uVar19 + uVar24;
          uVar18 = uVar18 + (uint)uVar23 * (uint)uVar1;
        } while (uVar21 != uVar13);
      }
    }
  }
  else if (((uVar2 | uVar1) & 1) == 0) {
    uVar7 = this->m_componentNum;
    if ((ulong)uVar7 != 0) {
      pfVar6 = this->m_mem;
      uVar12 = pFVar8->m_width;
      uVar3 = pFVar8->m_height;
      uVar21 = 0;
      do {
        pfVar26 = pfVar6 + uVar2 * uVar24 * (int)uVar21;
        pfVar22 = pfVar9 + (uint)uVar3 * (uint)uVar12 * (int)uVar21;
        uVar18 = 0;
        do {
          uVar19 = 0;
          do {
            *pfVar22 = (*pfVar26 + pfVar26[1] + pfVar26[uVar1] + pfVar26[(ulong)uVar1 + 1]) * 0.25;
            pfVar22 = pfVar22 + 1;
            pfVar26 = pfVar26 + 2;
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar23);
          pfVar26 = pfVar26 + uVar1;
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar13);
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar7);
    }
  }
  else {
    if ((uVar1 & 1) != 0) {
      if ((uVar2 & 1) != 0) {
        uVar7 = this->m_componentNum;
        if ((ulong)uVar7 == 0) {
          return pFVar8;
        }
        iVar17 = uVar2 * uVar24;
        pfVar6 = this->m_mem;
        uVar2 = pFVar8->m_width;
        uVar3 = pFVar8->m_height;
        fVar28 = (float)(int)(short)uVar23;
        uVar20 = (ulong)((uint)uVar1 * 8);
        uVar27 = 0;
        uVar21 = 0;
        do {
          pfVar26 = pfVar6 + (ulong)uVar1 + uVar27 + 1;
          lVar25 = (long)pfVar6 + uVar27 * 4 + uVar20 + 4;
          pfVar22 = pfVar6 + (uint)(iVar17 * (int)uVar21);
          pfVar15 = pfVar9 + (uint)uVar3 * (uint)uVar2 * (int)uVar21;
          uVar24 = 0;
          do {
            uVar19 = uVar13 - uVar24;
            uVar24 = uVar24 + 1;
            uVar14 = 1;
            uVar11 = 0;
            uVar18 = (uint)uVar23;
            do {
              fVar29 = (float)uVar18;
              fVar30 = (float)uVar14 * *(float *)((long)pfVar22 + uVar11 * 2 + 8);
              *(float *)((long)pfVar15 + uVar11) =
                   ((fVar29 * *(float *)(lVar25 + -4 + uVar11 * 2) +
                     *(float *)(lVar25 + uVar11 * 2) * fVar28 + fVar30) * (float)(int)uVar24 +
                   (*(float *)((long)pfVar26 + uVar11 * 2 + -4) * fVar29 +
                    *(float *)((long)pfVar26 + uVar11 * 2) * fVar28 + fVar30) *
                   (float)(int)(short)uVar12 +
                   (*(float *)((long)pfVar22 + uVar11 * 2) * fVar29 +
                    *(float *)((long)pfVar22 + uVar11 * 2 + 4) * fVar28 + fVar30) * (float)uVar19 +
                   0.0) * (1.0 / (float)iVar17);
              uVar18 = uVar18 - 1;
              uVar11 = uVar11 + 4;
              uVar14 = uVar14 + 1;
            } while ((uint)uVar23 * 4 != uVar11);
            pfVar22 = (float *)((long)pfVar22 + uVar20);
            pfVar26 = (float *)((long)pfVar26 + uVar20);
            lVar25 = lVar25 + uVar20;
            pfVar15 = (float *)((long)pfVar15 + uVar11);
          } while (uVar24 != uVar13);
          uVar21 = uVar21 + 1;
          uVar27 = (ulong)(uint)((int)uVar27 + iVar17);
        } while (uVar21 != uVar7);
        return pFVar8;
      }
      if ((uVar1 & 1) != 0) {
        uVar7 = this->m_componentNum;
        if ((ulong)uVar7 == 0) {
          return pFVar8;
        }
        pfVar6 = this->m_mem;
        iVar17 = uVar2 * uVar24;
        uVar12 = pFVar8->m_width;
        uVar2 = pFVar8->m_height;
        uVar18 = 0;
        uVar21 = 0;
        do {
          pfVar26 = pfVar6 + (ulong)uVar24 + (ulong)uVar18 + 2;
          pfVar22 = pfVar6 + (uint)(iVar17 * (int)uVar21);
          pfVar15 = pfVar9 + (uint)uVar2 * (uint)uVar12 * (int)uVar21;
          uVar19 = 0;
          do {
            uVar16 = 1;
            uVar20 = 0;
            uVar14 = (uint)uVar23;
            do {
              *(float *)((long)pfVar15 + uVar20) =
                   ((*(float *)((long)pfVar22 + uVar20 * 2 + 8) +
                    *(float *)((long)pfVar26 + uVar20 * 2)) * (float)uVar16 +
                   (*(float *)((long)pfVar22 + uVar20 * 2 + 4) +
                   *(float *)((long)pfVar26 + uVar20 * 2 + -4)) * (float)(int)(short)uVar23 +
                   (*(float *)((long)pfVar22 + uVar20 * 2) +
                   *(float *)((long)pfVar26 + uVar20 * 2 + -8)) * (float)uVar14 + 0.0) *
                   (1.0 / (float)((uint)uVar1 + (uint)uVar1));
              uVar14 = uVar14 - 1;
              uVar20 = uVar20 + 4;
              uVar16 = uVar16 + 1;
            } while ((uint)uVar23 * 4 != uVar20);
            pfVar22 = (float *)((long)pfVar22 + (ulong)((uint)uVar1 * 8));
            uVar19 = uVar19 + 1;
            pfVar26 = (float *)((long)pfVar26 + (ulong)((uint)uVar1 * 8));
            pfVar15 = (float *)((long)pfVar15 + uVar20);
          } while (uVar19 != uVar13);
          uVar21 = uVar21 + 1;
          uVar18 = uVar18 + iVar17;
        } while (uVar21 != uVar7);
        return pFVar8;
      }
    }
    if (((uVar2 & 1) != 0) && (uVar7 = this->m_componentNum, (ulong)uVar7 != 0)) {
      pfVar6 = this->m_mem;
      iVar17 = uVar24 * uVar2;
      uVar3 = pFVar8->m_width;
      uVar4 = pFVar8->m_height;
      uVar21 = (ulong)((uint)uVar1 * 8);
      uVar24 = 0;
      uVar20 = 0;
      do {
        pfVar26 = pfVar6 + (ulong)uVar1 + (ulong)uVar24 + 1;
        lVar25 = (long)pfVar6 + (ulong)uVar24 * 4 + uVar21 + 4;
        pfVar22 = pfVar6 + (uint)(iVar17 * (int)uVar20);
        pfVar15 = pfVar9 + (uint)uVar4 * (uint)uVar3 * (int)uVar20;
        uVar18 = 0;
        do {
          uVar19 = uVar13 - uVar18;
          uVar18 = uVar18 + 1;
          lVar10 = 0;
          do {
            *(float *)((long)pfVar15 + lVar10) =
                 ((*(float *)(lVar25 + -4 + lVar10 * 2) + *(float *)(lVar25 + lVar10 * 2)) *
                  (float)(int)uVar18 +
                 (*(float *)((long)pfVar26 + lVar10 * 2 + -4) +
                 *(float *)((long)pfVar26 + lVar10 * 2)) * (float)(int)(short)uVar12 +
                 (*(float *)((long)pfVar22 + lVar10 * 2) +
                 *(float *)((long)pfVar22 + lVar10 * 2 + 4)) * (float)uVar19 + 0.0) *
                 (1.0 / (float)((uint)uVar2 + (uint)uVar2));
            lVar10 = lVar10 + 4;
          } while ((ulong)uVar23 << 2 != lVar10);
          pfVar22 = (float *)((long)pfVar22 + uVar21);
          pfVar26 = (float *)((long)pfVar26 + uVar21);
          lVar25 = lVar25 + uVar21;
          pfVar15 = (float *)((long)pfVar15 + lVar10);
        } while (uVar18 != uVar13);
        uVar20 = uVar20 + 1;
        uVar24 = uVar24 + iVar17;
      } while (uVar20 != uVar7);
    }
  }
  return pFVar8;
}

Assistant:

FloatImage * FloatImage::fastDownSample() const
{
	nvDebugCheck(m_width != 1 || m_height != 1);
	
	AutoPtr<FloatImage> dst_image( new FloatImage() );

	const uint w = max(1, m_width / 2);
	const uint h = max(1, m_height / 2);
	dst_image->allocate(m_componentNum, w, h);

	// 1D box filter.
	if (m_width == 1 || m_height == 1)
	{
		const uint n = w * h;
		
		if ((m_width * m_height) & 1)
		{
			const float scale = 1.0f / (2 * n + 1);
			
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					const float w0 = float(n - x);
					const float w1 = float(n - 0);
					const float w2 = float(1 + x);
					
					*dst++ = scale * (w0 * src[0] + w1 * src[1] + w2 * src[2]);
					src += 2;
				}
			}
		}
		else
		{
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					*dst = 0.5f * (src[0] + src[1]);
					dst++;
					src += 2;
				}
			}
		}
	}
	
	// Regular box filter.
	else if ((m_width & 1) == 0 && (m_height & 1) == 0)
	{
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for(uint x = 0; x < w; x++)
				{
					*dst = 0.25f * (src[0] + src[1] + src[m_width] + src[m_width + 1]);
					dst++;
					src += 2;
				}
				
				src += m_width;
			}
		}
	}
	
	// Polyphase filters.
	else if (m_width & 1 && m_height & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (m_width * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += v0 * (w0 * src[0 * m_width + 2 * x] + w1 * src[0 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v1 * (w0 * src[1 * m_width + 2 * x] + w1 * src[1 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v2 * (w0 * src[2 * m_width + 2 * x] + w1 * src[2 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_width & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		const float scale = 1.0f / (2 * m_width);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += w0 * (src[2 * x + 0] + src[m_width + 2 * x + 0]);
					f += w1 * (src[2 * x + 1] + src[m_width + 2 * x + 1]);
					f += w2 * (src[2 * x + 2] + src[m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_height & 1)
	{
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (2 * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					float f = 0.0f;
					f += v0 * (src[0 * m_width + 2 * x] + src[0 * m_width + 2 * x + 1]);
					f += v1 * (src[1 * m_width + 2 * x] + src[1 * m_width + 2 * x + 1]);
					f += v2 * (src[2 * m_width + 2 * x] + src[2 * m_width + 2 * x + 1]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	
	return dst_image.release();
}